

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O2

bool google::protobuf::internal::anon_unknown_36::HasLazyRep
               (FieldDescriptor *field,FieldOptions *options)

{
  bool bVar1;
  
  if (field->type_ == '\v') {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      bVar1 = options->lazy_opt != 0;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool HasLazyRep(const FieldDescriptor* field,
                const TailCallTableInfo::FieldOptions& options) {
  return field->type() == field->TYPE_MESSAGE && !field->is_repeated() &&
         options.lazy_opt != 0;
}